

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg_tracing_helpers.hpp
# Opt level: O2

void so_5::impl::msg_tracing_helpers::details::
     make_trace_to<so_5::impl::msg_tracing_helpers::details::text_separator,so_5::abstract_message_box_t&,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&>
               (ostream *s,text_separator *a,abstract_message_box_t *other,type_index *other_1,
               intrusive_ptr_t<so_5::message_t> *other_2)

{
  make_trace_to_1(s,(text_separator)a->m_text);
  make_trace_to<so_5::abstract_message_box_t&,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&>
            (s,other,other_1,other_2);
  return;
}

Assistant:

void
make_trace_to( std::ostream & s, A && a, OTHER &&... other )
	{
		make_trace_to_1( s, std::forward< A >(a) );
		make_trace_to( s, std::forward< OTHER >(other)... );
	}